

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalable_encoder.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__nptr;
  char *__filename;
  char *__filename_00;
  char *__filename_01;
  _Bool _Var1;
  aom_codec_err_t aVar2;
  int iVar3;
  long lVar4;
  aom_codec_iface_t *iface;
  long lVar5;
  ulong uVar6;
  aom_image_t *paVar7;
  char *pcVar8;
  FILE *__stream;
  FILE *__stream_00;
  FILE *__stream_01;
  undefined8 *in_RSI;
  int in_EDI;
  int flags;
  aom_codec_ctx_t codec;
  aom_codec_iface_t *encoder;
  FILE *outfile;
  char *outfile_arg;
  char *infile1_arg;
  char *infile0_arg;
  char *height_arg;
  char *width_arg;
  char *codec_arg;
  int frames_encoded;
  int max_frames;
  int keyframe_interval;
  int bitrate;
  int fps;
  AvxVideoInfo info;
  aom_codec_err_t res;
  aom_image_t raw1;
  aom_image_t raw0;
  int frame_count;
  aom_codec_enc_cfg_t cfg;
  FILE *infile1;
  FILE *infile0;
  aom_codec_ctx_t *in_stack_fffffffffffffa48;
  uint in_stack_fffffffffffffa54;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  int in_stack_fffffffffffffa64;
  FILE *in_stack_fffffffffffffa68;
  uint in_stack_fffffffffffffa70;
  uint in_stack_fffffffffffffa74;
  uint in_stack_fffffffffffffa78;
  aom_img_fmt_t in_stack_fffffffffffffa7c;
  anon_union_8_3_eb73a190_for_config in_stack_fffffffffffffa80;
  int local_530;
  uint32_t local_51c;
  uint local_518;
  int local_514;
  undefined4 local_510;
  undefined4 local_50c;
  aom_codec_err_t local_504;
  int local_3ac;
  
  local_3ac = 0;
  local_530 = 0;
  exec_name = (char *)*in_RSI;
  memset(&local_51c,0,0x18);
  if (in_EDI != 8) {
    die("Invalid number of arguments");
  }
  pcVar8 = (char *)in_RSI[2];
  __nptr = (char *)in_RSI[3];
  __filename = (char *)in_RSI[4];
  __filename_00 = (char *)in_RSI[5];
  __filename_01 = (char *)in_RSI[6];
  lVar4 = strtol((char *)in_RSI[7],(char **)0x0,0);
  iface = get_aom_encoder_by_short_name((char *)in_stack_fffffffffffffa58);
  if (iface == (aom_codec_iface_t *)0x0) {
    die("Unsupported codec.");
  }
  local_51c = get_fourcc_by_aom_encoder((aom_codec_iface_t *)in_stack_fffffffffffffa58);
  lVar5 = strtol(pcVar8,(char **)0x0,0);
  local_518 = (uint)lVar5;
  uVar6 = strtol(__nptr,(char **)0x0,0);
  local_514 = (int)uVar6;
  local_510 = 1;
  local_50c = 0x1e;
  if (((((int)local_518 < 1) || (local_514 < 1)) || ((int)local_518 % 2 != 0)) ||
     (local_514 % 2 != 0)) {
    die("Invalid frame size: %dx%d",(ulong)local_518,uVar6 & 0xffffffff);
  }
  paVar7 = aom_img_alloc((aom_image_t *)in_stack_fffffffffffffa80.dec,in_stack_fffffffffffffa7c,
                         in_stack_fffffffffffffa78,in_stack_fffffffffffffa74,
                         in_stack_fffffffffffffa70);
  if (paVar7 == (aom_image_t *)0x0) {
    die("Failed to allocate image for layer 0.");
  }
  paVar7 = aom_img_alloc((aom_image_t *)in_stack_fffffffffffffa80.dec,in_stack_fffffffffffffa7c,
                         in_stack_fffffffffffffa78,in_stack_fffffffffffffa74,
                         in_stack_fffffffffffffa70);
  if (paVar7 == (aom_image_t *)0x0) {
    die("Failed to allocate image for layer 1.");
  }
  pcVar8 = aom_codec_iface_name(iface);
  printf("Using %s\n",pcVar8);
  local_504 = aom_codec_enc_config_default
                        ((aom_codec_iface_t *)
                         CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                         in_stack_fffffffffffffa58,in_stack_fffffffffffffa54);
  if (local_504 != AOM_CODEC_OK) {
    die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
              (char *)in_stack_fffffffffffffa58);
  }
  __stream = fopen64(__filename_01,"wb");
  if (__stream == (FILE *)0x0) {
    die("Failed to open %s for writing.",__filename_01);
  }
  __stream_00 = fopen64(__filename,"rb");
  if (__stream_00 == (FILE *)0x0) {
    die("Failed to open %s for reading.",__filename);
  }
  __stream_01 = fopen64(__filename_00,"rb");
  if (__stream_01 == (FILE *)0x0) {
    die("Failed to open %s for reading.",__filename);
  }
  aVar2 = aom_codec_enc_init_ver
                    ((aom_codec_ctx_t *)in_stack_fffffffffffffa80.dec,
                     (aom_codec_iface_t *)
                     CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     (aom_codec_enc_cfg_t *)
                     CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                     (aom_codec_flags_t)in_stack_fffffffffffffa68,in_stack_fffffffffffffa64);
  if (aVar2 != AOM_CODEC_OK) {
    die("Failed to initialize encoder");
  }
  aVar2 = aom_codec_control((aom_codec_ctx_t *)&stack0xfffffffffffffa58,0xd,8);
  if (aVar2 != AOM_CODEC_OK) {
    die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
              (char *)in_stack_fffffffffffffa58);
  }
  aVar2 = aom_codec_control((aom_codec_ctx_t *)&stack0xfffffffffffffa58,0x21,2);
  if (aVar2 != AOM_CODEC_OK) {
    die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
              (char *)in_stack_fffffffffffffa58);
  }
  aVar2 = aom_codec_control((aom_codec_ctx_t *)&stack0xfffffffffffffa58,0x46,3);
  if (aVar2 != AOM_CODEC_OK) {
    die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
              (char *)in_stack_fffffffffffffa58);
  }
  aVar2 = aom_codec_control((aom_codec_ctx_t *)&stack0xfffffffffffffa58,0x1b,2);
  if (aVar2 != AOM_CODEC_OK) {
    die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
              (char *)in_stack_fffffffffffffa58);
  }
  do {
    _Var1 = aom_img_read((aom_image_t *)in_stack_fffffffffffffa68,
                         (FILE *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    if (!_Var1) break;
    aVar2 = aom_codec_enc_config_set
                      ((aom_codec_ctx_t *)
                       CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                       in_stack_fffffffffffffa58);
    if (aVar2 != AOM_CODEC_OK) {
      die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                (char *)in_stack_fffffffffffffa58);
    }
    aVar2 = aom_codec_control((aom_codec_ctx_t *)&stack0xfffffffffffffa58,0xc,0);
    if (aVar2 != AOM_CODEC_OK) {
      die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                (char *)in_stack_fffffffffffffa58);
    }
    aVar2 = aom_codec_control((aom_codec_ctx_t *)&stack0xfffffffffffffa58,0x19,0x3e);
    if (aVar2 != AOM_CODEC_OK) {
      die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                (char *)in_stack_fffffffffffffa58);
    }
    encode_frame((aom_codec_ctx_t *)in_stack_fffffffffffffa80.dec,
                 (aom_image_t *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 in_stack_fffffffffffffa74,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    aom_img_read((aom_image_t *)in_stack_fffffffffffffa68,
                 (FILE *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    aVar2 = aom_codec_enc_config_set
                      ((aom_codec_ctx_t *)
                       CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                       in_stack_fffffffffffffa58);
    if (aVar2 != AOM_CODEC_OK) {
      die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                (char *)in_stack_fffffffffffffa58);
    }
    aVar2 = aom_codec_control((aom_codec_ctx_t *)&stack0xfffffffffffffa58,0xc,1);
    if (aVar2 != AOM_CODEC_OK) {
      die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                (char *)in_stack_fffffffffffffa58);
    }
    aVar2 = aom_codec_control((aom_codec_ctx_t *)&stack0xfffffffffffffa58,0x19,10);
    if (aVar2 != AOM_CODEC_OK) {
      die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                (char *)in_stack_fffffffffffffa58);
    }
    local_3ac = local_3ac + 2;
    encode_frame((aom_codec_ctx_t *)in_stack_fffffffffffffa80.dec,
                 (aom_image_t *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 in_stack_fffffffffffffa74,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    local_530 = local_530 + 1;
  } while (((int)lVar4 < 1) || (local_530 < (int)lVar4));
  do {
    iVar3 = encode_frame((aom_codec_ctx_t *)in_stack_fffffffffffffa80.dec,
                         (aom_image_t *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                         in_stack_fffffffffffffa74,in_stack_fffffffffffffa70,
                         in_stack_fffffffffffffa68);
  } while (iVar3 != 0);
  printf("\n");
  fclose(__stream_00);
  fclose(__stream_01);
  printf("Processed %d frames.\n",(long)local_3ac / 2 & 0xffffffff,(long)local_3ac % 2 & 0xffffffff)
  ;
  aom_img_free((aom_image_t *)0x11932e);
  aom_img_free((aom_image_t *)0x11933b);
  aVar2 = aom_codec_destroy(in_stack_fffffffffffffa48);
  if (aVar2 == AOM_CODEC_OK) {
    fclose(__stream);
    return 0;
  }
  die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
            (char *)in_stack_fffffffffffffa58);
}

Assistant:

int main(int argc, char **argv) {
  FILE *infile0 = NULL;
  FILE *infile1 = NULL;
  aom_codec_enc_cfg_t cfg;
  int frame_count = 0;
  aom_image_t raw0, raw1;
  aom_codec_err_t res;
  AvxVideoInfo info;
  const int fps = 30;
  const int bitrate = 200;
  int keyframe_interval = 0;
  int max_frames = 0;
  int frames_encoded = 0;
  const char *codec_arg = NULL;
  const char *width_arg = NULL;
  const char *height_arg = NULL;
  const char *infile0_arg = NULL;
  const char *infile1_arg = NULL;
  const char *outfile_arg = NULL;
  //  const char *keyframe_interval_arg = NULL;
  FILE *outfile = NULL;

  exec_name = argv[0];

  // Clear explicitly, as simply assigning "{ 0 }" generates
  // "missing-field-initializers" warning in some compilers.
  memset(&info, 0, sizeof(info));

  if (argc != 8) die("Invalid number of arguments");

  codec_arg = argv[1];
  width_arg = argv[2];
  height_arg = argv[3];
  infile0_arg = argv[4];
  infile1_arg = argv[5];
  outfile_arg = argv[6];
  max_frames = (int)strtol(argv[7], NULL, 0);

  aom_codec_iface_t *encoder = get_aom_encoder_by_short_name(codec_arg);
  if (!encoder) die("Unsupported codec.");

  info.codec_fourcc = get_fourcc_by_aom_encoder(encoder);
  info.frame_width = (int)strtol(width_arg, NULL, 0);
  info.frame_height = (int)strtol(height_arg, NULL, 0);
  info.time_base.numerator = 1;
  info.time_base.denominator = fps;

  if (info.frame_width <= 0 || info.frame_height <= 0 ||
      (info.frame_width % 2) != 0 || (info.frame_height % 2) != 0) {
    die("Invalid frame size: %dx%d", info.frame_width, info.frame_height);
  }

  if (!aom_img_alloc(&raw0, AOM_IMG_FMT_I420, info.frame_width,
                     info.frame_height, 1)) {
    die("Failed to allocate image for layer 0.");
  }
  if (!aom_img_alloc(&raw1, AOM_IMG_FMT_I420, info.frame_width,
                     info.frame_height, 1)) {
    die("Failed to allocate image for layer 1.");
  }

  //  keyframe_interval = (int)strtol(keyframe_interval_arg, NULL, 0);
  keyframe_interval = 100;
  if (keyframe_interval < 0) die("Invalid keyframe interval value.");

  printf("Using %s\n", aom_codec_iface_name(encoder));

  aom_codec_ctx_t codec;
  res = aom_codec_enc_config_default(encoder, &cfg, 0);
  if (res) die_codec(&codec, "Failed to get default codec config.");

  cfg.g_w = info.frame_width;
  cfg.g_h = info.frame_height;
  cfg.g_timebase.num = info.time_base.numerator;
  cfg.g_timebase.den = info.time_base.denominator;
  cfg.rc_target_bitrate = bitrate;
  cfg.g_error_resilient = 0;
  cfg.g_lag_in_frames = 0;
  cfg.rc_end_usage = AOM_Q;
  cfg.save_as_annexb = 0;

  outfile = fopen(outfile_arg, "wb");
  if (!outfile) die("Failed to open %s for writing.", outfile_arg);

  if (!(infile0 = fopen(infile0_arg, "rb")))
    die("Failed to open %s for reading.", infile0_arg);
  if (!(infile1 = fopen(infile1_arg, "rb")))
    die("Failed to open %s for reading.", infile0_arg);

  if (aom_codec_enc_init(&codec, encoder, &cfg, 0))
    die("Failed to initialize encoder");
  if (aom_codec_control(&codec, AOME_SET_CPUUSED, 8))
    die_codec(&codec, "Failed to set cpu to 8");

  if (aom_codec_control(&codec, AV1E_SET_TILE_COLUMNS, 2))
    die_codec(&codec, "Failed to set tile columns to 2");
  if (aom_codec_control(&codec, AV1E_SET_NUM_TG, 3))
    die_codec(&codec, "Failed to set num of tile groups to 3");

  if (aom_codec_control(&codec, AOME_SET_NUMBER_SPATIAL_LAYERS, 2))
    die_codec(&codec, "Failed to set number of spatial layers to 2");

  // Encode frames.
  while (aom_img_read(&raw0, infile0)) {
    int flags = 0;

    // configure and encode base layer

    if (keyframe_interval > 0 && frames_encoded % keyframe_interval == 0)
      flags |= AOM_EFLAG_FORCE_KF;
    else
      // use previous base layer (LAST) as sole reference
      // save this frame as LAST to be used as reference by enhanmcent layer
      // and next base layer
      flags |= AOM_EFLAG_NO_REF_LAST2 | AOM_EFLAG_NO_REF_LAST3 |
               AOM_EFLAG_NO_REF_GF | AOM_EFLAG_NO_REF_ARF |
               AOM_EFLAG_NO_REF_BWD | AOM_EFLAG_NO_REF_ARF2 |
               AOM_EFLAG_NO_UPD_GF | AOM_EFLAG_NO_UPD_ARF |
               AOM_EFLAG_NO_UPD_ENTROPY;
    cfg.g_w = info.frame_width;
    cfg.g_h = info.frame_height;
    if (aom_codec_enc_config_set(&codec, &cfg))
      die_codec(&codec, "Failed to set enc cfg for layer 0");
    if (aom_codec_control(&codec, AOME_SET_SPATIAL_LAYER_ID, 0))
      die_codec(&codec, "Failed to set layer id to 0");
    if (aom_codec_control(&codec, AOME_SET_CQ_LEVEL, 62))
      die_codec(&codec, "Failed to set cq level");
    encode_frame(&codec, &raw0, frame_count++, flags, outfile);

    // configure and encode enhancement layer

    //  use LAST (base layer) as sole reference
    flags = AOM_EFLAG_NO_REF_LAST2 | AOM_EFLAG_NO_REF_LAST3 |
            AOM_EFLAG_NO_REF_GF | AOM_EFLAG_NO_REF_ARF | AOM_EFLAG_NO_REF_BWD |
            AOM_EFLAG_NO_REF_ARF2 | AOM_EFLAG_NO_UPD_LAST |
            AOM_EFLAG_NO_UPD_GF | AOM_EFLAG_NO_UPD_ARF |
            AOM_EFLAG_NO_UPD_ENTROPY;
    cfg.g_w = info.frame_width;
    cfg.g_h = info.frame_height;
    aom_img_read(&raw1, infile1);
    if (aom_codec_enc_config_set(&codec, &cfg))
      die_codec(&codec, "Failed to set enc cfg for layer 1");
    if (aom_codec_control(&codec, AOME_SET_SPATIAL_LAYER_ID, 1))
      die_codec(&codec, "Failed to set layer id to 1");
    if (aom_codec_control(&codec, AOME_SET_CQ_LEVEL, 10))
      die_codec(&codec, "Failed to set cq level");
    encode_frame(&codec, &raw1, frame_count++, flags, outfile);

    frames_encoded++;

    if (max_frames > 0 && frames_encoded >= max_frames) break;
  }

  // Flush encoder.
  while (encode_frame(&codec, NULL, -1, 0, outfile)) continue;

  printf("\n");
  fclose(infile0);
  fclose(infile1);
  printf("Processed %d frames.\n", frame_count / 2);

  aom_img_free(&raw0);
  aom_img_free(&raw1);
  if (aom_codec_destroy(&codec)) die_codec(&codec, "Failed to destroy codec.");

  fclose(outfile);

  return EXIT_SUCCESS;
}